

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

uint64_t read_uint64(dwarf_buf *buf)

{
  byte *pbVar1;
  int iVar2;
  uchar *p;
  dwarf_buf *buf_local;
  
  pbVar1 = buf->buf;
  iVar2 = advance(buf,8);
  if (iVar2 == 0) {
    buf_local = (dwarf_buf *)0x0;
  }
  else if (buf->is_bigendian == 0) {
    buf_local = (dwarf_buf *)
                ((ulong)pbVar1[7] << 0x38 | (ulong)pbVar1[6] << 0x30 | (ulong)pbVar1[5] << 0x28 |
                 (ulong)pbVar1[4] << 0x20 | (ulong)pbVar1[3] << 0x18 | (ulong)pbVar1[2] << 0x10 |
                 (ulong)pbVar1[1] << 8 | (ulong)*pbVar1);
  }
  else {
    buf_local = (dwarf_buf *)
                ((ulong)*pbVar1 << 0x38 | (ulong)pbVar1[1] << 0x30 | (ulong)pbVar1[2] << 0x28 |
                 (ulong)pbVar1[3] << 0x20 | (ulong)pbVar1[4] << 0x18 | (ulong)pbVar1[5] << 0x10 |
                 (ulong)pbVar1[6] << 8 | (ulong)pbVar1[7]);
  }
  return (uint64_t)buf_local;
}

Assistant:

static uint64_t
read_uint64 (struct dwarf_buf *buf)
{
  const unsigned char *p = buf->buf;

  if (!advance (buf, 8))
    return 0;
  if (buf->is_bigendian)
    return (((uint64_t) p[0] << 56) | ((uint64_t) p[1] << 48)
	    | ((uint64_t) p[2] << 40) | ((uint64_t) p[3] << 32)
	    | ((uint64_t) p[4] << 24) | ((uint64_t) p[5] << 16)
	    | ((uint64_t) p[6] << 8) | (uint64_t) p[7]);
  else
    return (((uint64_t) p[7] << 56) | ((uint64_t) p[6] << 48)
	    | ((uint64_t) p[5] << 40) | ((uint64_t) p[4] << 32)
	    | ((uint64_t) p[3] << 24) | ((uint64_t) p[2] << 16)
	    | ((uint64_t) p[1] << 8) | (uint64_t) p[0]);
}